

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_read_format_zip.c
# Opt level: O1

void verify_contents(archive *a,int seeking,int improved_streaming)

{
  archive *a_00;
  int iVar1;
  mode_t mVar2;
  wchar_t wVar3;
  time_t tVar4;
  long lVar5;
  char *pcVar6;
  la_int64_t lVar7;
  la_ssize_t lVar8;
  longlong v1;
  char *e2;
  archive_entry *ae;
  char filedata [64];
  archive_entry *local_90;
  uint local_88;
  int local_84;
  archive *local_80;
  undefined1 local_78 [72];
  
  iVar1 = archive_read_next_header(a,&local_90);
  local_80 = a;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ę',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a);
  tVar4 = archive_entry_mtime(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ę',1,"1",tVar4,"archive_entry_mtime(ae)",(void *)0x0);
  lVar5 = archive_entry_mtime_nsec(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ě',0,"0",lVar5,"archive_entry_mtime_nsec(ae)",(void *)0x0);
  tVar4 = archive_entry_atime(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ĝ',0,"0",tVar4,"archive_entry_atime(ae)",(void *)0x0);
  tVar4 = archive_entry_ctime(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ĝ',0,"0",tVar4,"archive_entry_ctime(ae)",(void *)0x0);
  pcVar6 = archive_entry_pathname(local_90);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
             ,L'Ğ',"file","\"file\"",pcVar6,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  local_88 = improved_streaming | seeking;
  local_84 = seeking;
  if (local_88 != 0) {
    mVar2 = archive_entry_mode(local_90);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                        ,L'Ġ',0x81ed,"AE_IFREG | 0755",(ulong)mVar2,"archive_entry_mode(ae)",
                        (void *)0x0);
  }
  if (local_84 == 0) {
    wVar3 = archive_entry_size_is_set(local_90);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                        ,L'Ħ',0,"0",(long)wVar3,"archive_entry_size_is_set(ae)",(void *)0x0);
  }
  else {
    lVar7 = archive_entry_size(local_90);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                        ,L'ģ',8,"8",lVar7,"archive_entry_size(ae)",(void *)0x0);
    wVar3 = archive_entry_size_is_set(local_90);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                     ,L'Ĥ',wVar3,"archive_entry_size_is_set(ae)",(void *)0x0);
  }
  a_00 = local_80;
  lVar8 = archive_read_data(local_80,local_78,0x40);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ĩ',8,"8",lVar8,"archive_read_data(a, filedata, sizeof(filedata))",a_00);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ī',local_78,"filedata","12345678","\"12345678\"",8,"8",(void *)0x0);
  iVar1 = archive_read_next_header(a_00,&local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Į',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a_00);
  tVar4 = archive_entry_mtime(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'į',1,"1",tVar4,"archive_entry_mtime(ae)",(void *)0x0);
  lVar5 = archive_entry_mtime_nsec(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'İ',0,"0",lVar5,"archive_entry_mtime_nsec(ae)",(void *)0x0);
  tVar4 = archive_entry_atime(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ı',0,"0",tVar4,"archive_entry_atime(ae)",(void *)0x0);
  tVar4 = archive_entry_ctime(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ĳ',0,"0",tVar4,"archive_entry_ctime(ae)",(void *)0x0);
  pcVar6 = archive_entry_pathname(local_90);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
             ,L'ĳ',"file2","\"file2\"",pcVar6,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  if (local_88 != 0) {
    mVar2 = archive_entry_mode(local_90);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                        ,L'ĵ',0x81ed,"AE_IFREG | 0755",(ulong)mVar2,"archive_entry_mode(ae)",
                        (void *)0x0);
  }
  if (local_84 == 0) {
    wVar3 = archive_entry_size_is_set(local_90);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                        ,L'Ļ',0,"0",(long)wVar3,"archive_entry_size_is_set(ae)",(void *)0x0);
  }
  else {
    lVar7 = archive_entry_size(local_90);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                        ,L'ĸ',4,"4",lVar7,"archive_entry_size(ae)",(void *)0x0);
    wVar3 = archive_entry_size_is_set(local_90);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                     ,L'Ĺ',wVar3,"archive_entry_size_is_set(ae)",(void *)0x0);
  }
  lVar8 = archive_read_data(a_00,local_78,0x40);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ľ',4,"4",lVar8,"archive_read_data(a, filedata, sizeof(filedata))",a_00);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ŀ',local_78,"filedata","1234","\"1234\"",4,"4",(void *)0x0);
  iVar1 = archive_read_next_header(a_00,&local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ł',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a_00);
  tVar4 = archive_entry_mtime(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ń',2,"2",tVar4,"archive_entry_mtime(ae)",(void *)0x0);
  lVar5 = archive_entry_mtime_nsec(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ń',0,"0",lVar5,"archive_entry_mtime_nsec(ae)",(void *)0x0);
  tVar4 = archive_entry_atime(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ņ',0,"0",tVar4,"archive_entry_atime(ae)",(void *)0x0);
  tVar4 = archive_entry_ctime(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ņ',0,"0",tVar4,"archive_entry_ctime(ae)",(void *)0x0);
  pcVar6 = archive_entry_pathname(local_90);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
             ,L'Ň',"file3","\"file3\"",pcVar6,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  if (local_88 != 0) {
    mVar2 = archive_entry_mode(local_90);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                        ,L'ŉ',0x8191,"AE_IFREG | 0621",(ulong)mVar2,"archive_entry_mode(ae)",
                        (void *)0x0);
  }
  if (local_84 == 0) {
    wVar3 = archive_entry_size_is_set(local_90);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                        ,L'ŏ',0,"0",(long)wVar3,"archive_entry_size_is_set(ae)",(void *)0x0);
  }
  else {
    lVar7 = archive_entry_size(local_90);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                        ,L'Ō',5,"5",lVar7,"archive_entry_size(ae)",(void *)0x0);
    wVar3 = archive_entry_size_is_set(local_90);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                     ,L'ō',wVar3,"archive_entry_size_is_set(ae)",(void *)0x0);
  }
  lVar8 = archive_read_data(a_00,local_78,0x40);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Œ',5,"5",lVar8,"archive_read_data(a, filedata, sizeof(filedata))",a_00);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'œ',local_78,"filedata","mnopq","\"mnopq\"",5,"5",(void *)0x0);
  iVar1 = archive_read_next_header(a_00,&local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ŗ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a_00);
  tVar4 = archive_entry_mtime(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ŗ',1,"1",tVar4,"archive_entry_mtime(ae)",(void *)0x0);
  lVar5 = archive_entry_mtime_nsec(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ř',0,"0",lVar5,"archive_entry_mtime_nsec(ae)",(void *)0x0);
  tVar4 = archive_entry_atime(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ř',0,"0",tVar4,"archive_entry_atime(ae)",(void *)0x0);
  tVar4 = archive_entry_ctime(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ś',0,"0",tVar4,"archive_entry_ctime(ae)",(void *)0x0);
  pcVar6 = archive_entry_pathname(local_90);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
             ,L'ś',"symlink","\"symlink\"",pcVar6,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  mVar2 = archive_entry_mode(local_90);
  if (local_88 == 0) {
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                        ,L'ţ',0x81b4,"AE_IFREG | 0664",(ulong)mVar2,"archive_entry_mode(ae)",
                        (void *)0x0);
    lVar7 = archive_entry_size(local_90);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                        ,L'Ť',5,"5",lVar7,"archive_entry_size(ae)",(void *)0x0);
    wVar3 = archive_entry_size_is_set(local_90);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                     ,L'ť',wVar3,"archive_entry_size_is_set(ae)",(void *)0x0);
  }
  else {
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                        ,L'ŝ',0xa1ed,"AE_IFLNK | 0755",(ulong)mVar2,"archive_entry_mode(ae)",
                        (void *)0x0);
    lVar7 = archive_entry_size(local_90);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                        ,L'Ş',0,"0",lVar7,"archive_entry_size(ae)",(void *)0x0);
    pcVar6 = archive_entry_symlink(local_90);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
               ,L'ş',"file1","\"file1\"",pcVar6,"archive_entry_symlink(ae)",(void *)0x0,L'\0');
  }
  iVar1 = archive_read_next_header(a_00,&local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ũ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a_00);
  tVar4 = archive_entry_mtime(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ū',0xb,"11",tVar4,"archive_entry_mtime(ae)",(void *)0x0);
  lVar5 = archive_entry_mtime_nsec(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ū',0,"0",lVar5,"archive_entry_mtime_nsec(ae)",(void *)0x0);
  tVar4 = archive_entry_atime(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ŭ',0,"0",tVar4,"archive_entry_atime(ae)",(void *)0x0);
  tVar4 = archive_entry_ctime(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ŭ',0,"0",tVar4,"archive_entry_ctime(ae)",(void *)0x0);
  pcVar6 = archive_entry_pathname(local_90);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
             ,L'Ů',"dir/","\"dir/\"",pcVar6,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  if (local_88 != 0) {
    mVar2 = archive_entry_mode(local_90);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                        ,L'Ű',0x41ed,"AE_IFDIR | 0755",(ulong)mVar2,"archive_entry_mode(ae)",
                        (void *)0x0);
  }
  lVar7 = archive_entry_size(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ų',0,"0",lVar7,"archive_entry_size(ae)",(void *)0x0);
  wVar3 = archive_entry_size_is_set(local_90);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                   ,L'ų',wVar3,"archive_entry_size_is_set(ae)",(void *)0x0);
  lVar8 = archive_read_data(a_00,local_78,10);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ŵ',0,"0",lVar8,"archive_read_data(a, filedata, 10)",a_00);
  iVar1 = archive_read_next_header(a_00,&local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ż',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a_00);
  tVar4 = archive_entry_mtime(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ž',1,"1",tVar4,"archive_entry_mtime(ae)",(void *)0x0);
  lVar5 = archive_entry_mtime_nsec(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ſ',0,"0",lVar5,"archive_entry_mtime_nsec(ae)",(void *)0x0);
  tVar4 = archive_entry_atime(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ƀ',0,"0",tVar4,"archive_entry_atime(ae)",(void *)0x0);
  tVar4 = archive_entry_ctime(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ɓ',0,"0",tVar4,"archive_entry_ctime(ae)",(void *)0x0);
  pcVar6 = archive_entry_pathname(local_90);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
             ,L'Ƃ',"file_deflate","\"file_deflate\"",pcVar6,"archive_entry_pathname(ae)",
             (void *)0x0,L'\0');
  if (local_88 != 0) {
    mVar2 = archive_entry_mode(local_90);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                        ,L'Ƅ',0x81ed,"AE_IFREG | 0755",(ulong)mVar2,"archive_entry_mode(ae)",
                        (void *)0x0);
  }
  if (local_84 == 0) {
    wVar3 = archive_entry_size_is_set(local_90);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                        ,L'Ɗ',0,"0",(long)wVar3,"archive_entry_size_is_set(ae)",(void *)0x0);
  }
  else {
    lVar7 = archive_entry_size(local_90);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                        ,L'Ƈ',8,"8",lVar7,"archive_entry_size(ae)",(void *)0x0);
    wVar3 = archive_entry_size_is_set(local_90);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                     ,L'ƈ',wVar3,"archive_entry_size_is_set(ae)",(void *)0x0);
  }
  lVar8 = archive_read_data(a_00,local_78,0x40);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ƍ',8,"8",lVar8,"archive_read_data(a, filedata, sizeof(filedata))",a_00);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ǝ',local_78,"filedata","12345678","\"12345678\"",8,"8",(void *)0x0);
  iVar1 = archive_read_next_header(a_00,&local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ƒ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a_00);
  tVar4 = archive_entry_mtime(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ɠ',1,"1",tVar4,"archive_entry_mtime(ae)",(void *)0x0);
  lVar5 = archive_entry_mtime_nsec(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ɣ',0,"0",lVar5,"archive_entry_mtime_nsec(ae)",(void *)0x0);
  tVar4 = archive_entry_atime(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ƕ',0,"0",tVar4,"archive_entry_atime(ae)",(void *)0x0);
  tVar4 = archive_entry_ctime(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ɩ',0,"0",tVar4,"archive_entry_ctime(ae)",(void *)0x0);
  pcVar6 = archive_entry_pathname(local_90);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
             ,L'Ɨ',"file2_deflate","\"file2_deflate\"",pcVar6,"archive_entry_pathname(ae)",
             (void *)0x0,L'\0');
  if (local_88 != 0) {
    mVar2 = archive_entry_mode(local_90);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                        ,L'ƙ',0x81ed,"AE_IFREG | 0755",(ulong)mVar2,"archive_entry_mode(ae)",
                        (void *)0x0);
  }
  if (local_84 == 0) {
    wVar3 = archive_entry_size_is_set(local_90);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                        ,L'Ɵ',0,"0",(long)wVar3,"archive_entry_size_is_set(ae)",(void *)0x0);
  }
  else {
    lVar7 = archive_entry_size(local_90);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                        ,L'Ɯ',4,"4",lVar7,"archive_entry_size(ae)",(void *)0x0);
    wVar3 = archive_entry_size_is_set(local_90);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                     ,L'Ɲ',wVar3,"archive_entry_size_is_set(ae)",(void *)0x0);
  }
  lVar8 = archive_read_data(a_00,local_78,0x40);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ƣ',4,"4",lVar8,"archive_read_data(a, filedata, sizeof(filedata))",a_00);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ƣ',local_78,"filedata","1234","\"1234\"",4,"4",(void *)0x0);
  iVar1 = archive_read_next_header(a_00,&local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ʀ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a_00);
  tVar4 = archive_entry_mtime(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ƨ',2,"2",tVar4,"archive_entry_mtime(ae)",(void *)0x0);
  lVar5 = archive_entry_mtime_nsec(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ƨ',0,"0",lVar5,"archive_entry_mtime_nsec(ae)",(void *)0x0);
  tVar4 = archive_entry_atime(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ʃ',0,"0",tVar4,"archive_entry_atime(ae)",(void *)0x0);
  tVar4 = archive_entry_ctime(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ƪ',0,"0",tVar4,"archive_entry_ctime(ae)",(void *)0x0);
  pcVar6 = archive_entry_pathname(local_90);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
             ,L'ƫ',"file3_deflate","\"file3_deflate\"",pcVar6,"archive_entry_pathname(ae)",
             (void *)0x0,L'\0');
  if (local_88 != 0) {
    mVar2 = archive_entry_mode(local_90);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                        ,L'ƭ',0x8191,"AE_IFREG | 0621",(ulong)mVar2,"archive_entry_mode(ae)",
                        (void *)0x0);
  }
  if (local_84 == 0) {
    wVar3 = archive_entry_size_is_set(local_90);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                        ,L'Ƴ',0,"0",(long)wVar3,"archive_entry_size_is_set(ae)",(void *)0x0);
  }
  else {
    lVar7 = archive_entry_size(local_90);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                        ,L'ư',5,"5",lVar7,"archive_entry_size(ae)",(void *)0x0);
    wVar3 = archive_entry_size_is_set(local_90);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                     ,L'Ʊ',wVar3,"archive_entry_size_is_set(ae)",(void *)0x0);
  }
  lVar8 = archive_read_data(a_00,local_78,0x40);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ƶ',5,"5",lVar8,"archive_read_data(a, filedata, sizeof(filedata))",a_00);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ʒ',local_78,"filedata","ghijk","\"ghijk\"",4,"4",(void *)0x0);
  iVar1 = archive_read_next_header(a_00,&local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ƺ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a_00);
  tVar4 = archive_entry_mtime(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ƻ',1,"1",tVar4,"archive_entry_mtime(ae)",(void *)0x0);
  lVar5 = archive_entry_mtime_nsec(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ƽ',0,"0",lVar5,"archive_entry_mtime_nsec(ae)",(void *)0x0);
  tVar4 = archive_entry_atime(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ƽ',0,"0",tVar4,"archive_entry_atime(ae)",(void *)0x0);
  tVar4 = archive_entry_ctime(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ƾ',0,"0",tVar4,"archive_entry_ctime(ae)",(void *)0x0);
  pcVar6 = archive_entry_pathname(local_90);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
             ,L'ƿ',"symlink_deflate","\"symlink_deflate\"",pcVar6,"archive_entry_pathname(ae)",
             (void *)0x0,L'\0');
  mVar2 = archive_entry_mode(local_90);
  if (local_88 == 0) {
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                        ,L'ǅ',0x81b4,"AE_IFREG | 0664",(ulong)mVar2,"archive_entry_mode(ae)",
                        (void *)0x0);
    lVar7 = archive_entry_size(local_90);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                        ,L'ǆ',5,"5",lVar7,"archive_entry_size(ae)",(void *)0x0);
    lVar8 = archive_read_data(a_00,local_78,10);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                        ,L'Ǉ',5,"5",lVar8,"archive_read_data(a, filedata, 10)",a_00);
    assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                        ,L'ǈ',local_78,"filedata","file1","\"file1\"",5,"5",(void *)0x0);
  }
  else {
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                        ,L'ǁ',0xa1ed,"AE_IFLNK | 0755",(ulong)mVar2,"archive_entry_mode(ae)",
                        (void *)0x0);
    lVar7 = archive_entry_size(local_90);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                        ,L'ǂ',0,"0",lVar7,"archive_entry_size(ae)",(void *)0x0);
    pcVar6 = archive_entry_symlink(local_90);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
               ,L'ǃ',"file1","\"file1\"",pcVar6,"archive_entry_symlink(ae)",(void *)0x0,L'\0');
  }
  iVar1 = archive_read_next_header(a_00,&local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ǌ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a_00);
  tVar4 = archive_entry_mtime(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ǎ',0xb,"11",tVar4,"archive_entry_mtime(ae)",(void *)0x0);
  lVar5 = archive_entry_mtime_nsec(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ǎ',0,"0",lVar5,"archive_entry_mtime_nsec(ae)",(void *)0x0);
  tVar4 = archive_entry_atime(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ǐ',0,"0",tVar4,"archive_entry_atime(ae)",(void *)0x0);
  tVar4 = archive_entry_ctime(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ǐ',0,"0",tVar4,"archive_entry_ctime(ae)",(void *)0x0);
  pcVar6 = archive_entry_pathname(local_90);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
             ,L'Ǒ',"dir_deflate/","\"dir_deflate/\"",pcVar6,"archive_entry_pathname(ae)",
             (void *)0x0,L'\0');
  if (local_84 != 0) {
    mVar2 = archive_entry_mode(local_90);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                        ,L'Ǔ',0x41ed,"AE_IFDIR | 0755",(ulong)mVar2,"archive_entry_mode(ae)",
                        (void *)0x0);
  }
  lVar7 = archive_entry_size(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ǖ',0,"0",lVar7,"archive_entry_size(ae)",(void *)0x0);
  wVar3 = archive_entry_size_is_set(local_90);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                   ,L'ǖ',wVar3,"archive_entry_size_is_set(ae)",(void *)0x0);
  lVar8 = archive_read_data(a_00,local_78,10);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ǘ',0,"0",lVar8,"archive_read_data(a, filedata, 10)",a_00);
  iVar1 = archive_read_next_header(a_00,&local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ǟ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a_00);
  tVar4 = archive_entry_mtime(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ǡ',1,"1",tVar4,"archive_entry_mtime(ae)",(void *)0x0);
  lVar5 = archive_entry_mtime_nsec(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ǣ',0,"0",lVar5,"archive_entry_mtime_nsec(ae)",(void *)0x0);
  tVar4 = archive_entry_atime(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ǣ',0,"0",tVar4,"archive_entry_atime(ae)",(void *)0x0);
  tVar4 = archive_entry_ctime(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ǥ',0,"0",tVar4,"archive_entry_ctime(ae)",(void *)0x0);
  pcVar6 = archive_entry_pathname(local_90);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
             ,L'ǥ',"file_stored","\"file_stored\"",pcVar6,"archive_entry_pathname(ae)",(void *)0x0,
             L'\0');
  if (local_88 != 0) {
    mVar2 = archive_entry_mode(local_90);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                        ,L'ǧ',0x81ed,"AE_IFREG | 0755",(ulong)mVar2,"archive_entry_mode(ae)",
                        (void *)0x0);
  }
  wVar3 = archive_entry_size_is_set(local_90);
  if (local_84 == 0) {
    lVar7 = (la_int64_t)wVar3;
    pcVar6 = "0";
    e2 = "archive_entry_size_is_set(ae)";
    wVar3 = L'ǭ';
    v1 = 0;
  }
  else {
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                     ,L'Ǫ',wVar3,"archive_entry_size_is_set(ae)",(void *)0x0);
    lVar7 = archive_entry_size(local_90);
    pcVar6 = "8";
    e2 = "archive_entry_size(ae)";
    v1 = 8;
    wVar3 = L'ǫ';
  }
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,wVar3,v1,pcVar6,lVar7,e2,(void *)0x0);
  lVar8 = archive_read_data(a_00,local_78,0x40);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ǰ',8,"8",lVar8,"archive_read_data(a, filedata, sizeof(filedata))",a_00);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ǳ',local_78,"filedata","12345678","\"12345678\"",8,"8",(void *)0x0);
  iVar1 = archive_read_next_header(a_00,&local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ǵ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a_00);
  tVar4 = archive_entry_mtime(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ƕ',1,"1",tVar4,"archive_entry_mtime(ae)",(void *)0x0);
  lVar5 = archive_entry_mtime_nsec(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ƿ',0,"0",lVar5,"archive_entry_mtime_nsec(ae)",(void *)0x0);
  tVar4 = archive_entry_atime(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ǹ',0,"0",tVar4,"archive_entry_atime(ae)",(void *)0x0);
  tVar4 = archive_entry_ctime(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ǹ',0,"0",tVar4,"archive_entry_ctime(ae)",(void *)0x0);
  pcVar6 = archive_entry_pathname(local_90);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
             ,L'Ǻ',"file2_stored","\"file2_stored\"",pcVar6,"archive_entry_pathname(ae)",
             (void *)0x0,L'\0');
  if (local_88 != 0) {
    mVar2 = archive_entry_mode(local_90);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                        ,L'Ǽ',0x81ed,"AE_IFREG | 0755",(ulong)mVar2,"archive_entry_mode(ae)",
                        (void *)0x0);
  }
  if (local_84 == 0) {
    wVar3 = archive_entry_size_is_set(local_90);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                        ,L'Ȃ',0,"0",(long)wVar3,"archive_entry_size_is_set(ae)",(void *)0x0);
  }
  else {
    lVar7 = archive_entry_size(local_90);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                        ,L'ǿ',4,"4",lVar7,"archive_entry_size(ae)",(void *)0x0);
    wVar3 = archive_entry_size_is_set(local_90);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                     ,L'Ȁ',wVar3,"archive_entry_size_is_set(ae)",(void *)0x0);
  }
  lVar8 = archive_read_data(a_00,local_78,0x40);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ȅ',4,"4",lVar8,"archive_read_data(a, filedata, sizeof(filedata))",a_00);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ȇ',local_78,"filedata","ACEG","\"ACEG\"",4,"4",(void *)0x0);
  iVar1 = archive_read_next_header(a_00,&local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ȉ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a_00);
  tVar4 = archive_entry_mtime(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ȋ',2,"2",tVar4,"archive_entry_mtime(ae)",(void *)0x0);
  lVar5 = archive_entry_mtime_nsec(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ȋ',0,"0",lVar5,"archive_entry_mtime_nsec(ae)",(void *)0x0);
  tVar4 = archive_entry_atime(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ȍ',0,"0",tVar4,"archive_entry_atime(ae)",(void *)0x0);
  tVar4 = archive_entry_ctime(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ȍ',0,"0",tVar4,"archive_entry_ctime(ae)",(void *)0x0);
  pcVar6 = archive_entry_pathname(local_90);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
             ,L'Ȏ',"file3_stored","\"file3_stored\"",pcVar6,"archive_entry_pathname(ae)",
             (void *)0x0,L'\0');
  if (local_88 != 0) {
    mVar2 = archive_entry_mode(local_90);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                        ,L'Ȑ',0x8191,"AE_IFREG | 0621",(ulong)mVar2,"archive_entry_mode(ae)",
                        (void *)0x0);
  }
  if (local_84 == 0) {
    wVar3 = archive_entry_size_is_set(local_90);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                        ,L'ȕ',0,"0",(long)wVar3,"archive_entry_size_is_set(ae)",(void *)0x0);
  }
  else {
    lVar7 = archive_entry_size(local_90);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                        ,L'Ȓ',5,"5",lVar7,"archive_entry_size(ae)",(void *)0x0);
    wVar3 = archive_entry_size_is_set(local_90);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                     ,L'ȓ',wVar3,"archive_entry_size_is_set(ae)",(void *)0x0);
  }
  lVar8 = archive_read_data(a_00,local_78,0x40);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ș',5,"5",lVar8,"archive_read_data(a, filedata, sizeof(filedata))",a_00);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ș',local_78,"filedata","ijklm","\"ijklm\"",4,"4",(void *)0x0);
  iVar1 = archive_read_next_header(a_00,&local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ȝ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a_00);
  tVar4 = archive_entry_mtime(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ȝ',1,"1",tVar4,"archive_entry_mtime(ae)",(void *)0x0);
  lVar5 = archive_entry_mtime_nsec(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ȟ',0,"0",lVar5,"archive_entry_mtime_nsec(ae)",(void *)0x0);
  tVar4 = archive_entry_atime(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ȟ',0,"0",tVar4,"archive_entry_atime(ae)",(void *)0x0);
  tVar4 = archive_entry_ctime(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ƞ',0,"0",tVar4,"archive_entry_ctime(ae)",(void *)0x0);
  pcVar6 = archive_entry_pathname(local_90);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
             ,L'ȡ',"symlink_stored","\"symlink_stored\"",pcVar6,"archive_entry_pathname(ae)",
             (void *)0x0,L'\0');
  mVar2 = archive_entry_mode(local_90);
  if (local_88 == 0) {
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                        ,L'ȧ',0x81b4,"AE_IFREG | 0664",(ulong)mVar2,"archive_entry_mode(ae)",
                        (void *)0x0);
    lVar7 = archive_entry_size(local_90);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                        ,L'Ȩ',5,"5",lVar7,"archive_entry_size(ae)",(void *)0x0);
    lVar8 = archive_read_data(a_00,local_78,10);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                        ,L'ȩ',5,"5",lVar8,"archive_read_data(a, filedata, 10)",a_00);
    assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                        ,L'Ȫ',local_78,"filedata","file1","\"file1\"",5,"5",(void *)0x0);
  }
  else {
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                        ,L'ȣ',0xa1ed,"AE_IFLNK | 0755",(ulong)mVar2,"archive_entry_mode(ae)",
                        (void *)0x0);
    lVar7 = archive_entry_size(local_90);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                        ,L'Ȥ',0,"0",lVar7,"archive_entry_size(ae)",(void *)0x0);
    pcVar6 = archive_entry_symlink(local_90);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
               ,L'ȥ',"file1","\"file1\"",pcVar6,"archive_entry_symlink(ae)",(void *)0x0,L'\0');
  }
  iVar1 = archive_read_next_header(a_00,&local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ȯ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a_00);
  tVar4 = archive_entry_mtime(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ȯ',0xb,"11",tVar4,"archive_entry_mtime(ae)",(void *)0x0);
  lVar5 = archive_entry_mtime_nsec(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ȱ',0,"0",lVar5,"archive_entry_mtime_nsec(ae)",(void *)0x0);
  tVar4 = archive_entry_atime(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ȱ',0,"0",tVar4,"archive_entry_atime(ae)",(void *)0x0);
  tVar4 = archive_entry_ctime(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ȳ',0,"0",tVar4,"archive_entry_ctime(ae)",(void *)0x0);
  pcVar6 = archive_entry_pathname(local_90);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
             ,L'ȳ',"dir_stored/","\"dir_stored/\"",pcVar6,"archive_entry_pathname(ae)",(void *)0x0,
             L'\0');
  if (local_88 != 0) {
    mVar2 = archive_entry_mode(local_90);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                        ,L'ȵ',0x41ed,"AE_IFDIR | 0755",(ulong)mVar2,"archive_entry_mode(ae)",
                        (void *)0x0);
  }
  lVar7 = archive_entry_size(local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ȶ',0,"0",lVar7,"archive_entry_size(ae)",(void *)0x0);
  lVar8 = archive_read_data(a_00,local_78,10);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ȷ',0,"0",lVar8,"archive_read_data(a, filedata, 10)",a_00);
  iVar1 = archive_read_next_header(a_00,&local_90);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ⱥ',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",a_00);
  iVar1 = archive_read_close(a_00);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'Ȼ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
  iVar1 = archive_read_free(a_00);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_read_format_zip.c"
                      ,L'ȼ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

static void
verify_contents(struct archive *a, int seeking, int improved_streaming)
{
	char filedata[64];
	struct archive_entry *ae;

	/*
	 * Default compression options:
	 */

	/* Read and verify first file. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt(1, archive_entry_mtime(ae));
	/* Zip doesn't store high-resolution mtime. */
	assertEqualInt(0, archive_entry_mtime_nsec(ae));
	assertEqualInt(0, archive_entry_atime(ae));
	assertEqualInt(0, archive_entry_ctime(ae));
	assertEqualString("file", archive_entry_pathname(ae));
	if (seeking || improved_streaming) {
		assertEqualInt(AE_IFREG | 0755, archive_entry_mode(ae));
	}
	if (seeking) {
		assertEqualInt(8, archive_entry_size(ae));
		assert(archive_entry_size_is_set(ae));
	} else {
		assertEqualInt(0, archive_entry_size_is_set(ae));
	}
	assertEqualIntA(a, 8,
	    archive_read_data(a, filedata, sizeof(filedata)));
	assertEqualMem(filedata, "12345678", 8);


	/* Read the second file back. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt(1, archive_entry_mtime(ae));
	assertEqualInt(0, archive_entry_mtime_nsec(ae));
	assertEqualInt(0, archive_entry_atime(ae));
	assertEqualInt(0, archive_entry_ctime(ae));
	assertEqualString("file2", archive_entry_pathname(ae));
	if (seeking || improved_streaming) {
		assertEqualInt(AE_IFREG | 0755, archive_entry_mode(ae));
	}
	if (seeking) {
		assertEqualInt(4, archive_entry_size(ae));
		assert(archive_entry_size_is_set(ae));
	} else {
		assertEqualInt(0, archive_entry_size_is_set(ae));
	}
	assertEqualIntA(a, 4,
	    archive_read_data(a, filedata, sizeof(filedata)));
	assertEqualMem(filedata, "1234", 4);

	/* Read the third file back. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt(2, archive_entry_mtime(ae));
	assertEqualInt(0, archive_entry_mtime_nsec(ae));
	assertEqualInt(0, archive_entry_atime(ae));
	assertEqualInt(0, archive_entry_ctime(ae));
	assertEqualString("file3", archive_entry_pathname(ae));
	if (seeking || improved_streaming) {
		assertEqualInt(AE_IFREG | 0621, archive_entry_mode(ae));
	}
	if (seeking) {
		assertEqualInt(5, archive_entry_size(ae));
		assert(archive_entry_size_is_set(ae));
	} else {
		assertEqualInt(0, archive_entry_size_is_set(ae));
	}
	assertEqualIntA(a, 5,
	    archive_read_data(a, filedata, sizeof(filedata)));
	assertEqualMem(filedata, "mnopq", 5);

	/* Read symlink. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt(1, archive_entry_mtime(ae));
	assertEqualInt(0, archive_entry_mtime_nsec(ae));
	assertEqualInt(0, archive_entry_atime(ae));
	assertEqualInt(0, archive_entry_ctime(ae));
	assertEqualString("symlink", archive_entry_pathname(ae));
	if (seeking || improved_streaming) {
		assertEqualInt(AE_IFLNK | 0755, archive_entry_mode(ae));
		assertEqualInt(0, archive_entry_size(ae));
		assertEqualString("file1", archive_entry_symlink(ae));
	} else {
		/* Streaming cannot read file type, so
		 * symlink body shows as regular file contents. */
		assertEqualInt(AE_IFREG | 0664, archive_entry_mode(ae));
		assertEqualInt(5, archive_entry_size(ae));
		assert(archive_entry_size_is_set(ae));
	}

	/* Read the dir entry back. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt(11, archive_entry_mtime(ae));
	assertEqualInt(0, archive_entry_mtime_nsec(ae));
	assertEqualInt(0, archive_entry_atime(ae));
	assertEqualInt(0, archive_entry_ctime(ae));
	assertEqualString("dir/", archive_entry_pathname(ae));
	if (seeking || improved_streaming) {
		assertEqualInt(AE_IFDIR | 0755, archive_entry_mode(ae));
	}
	assertEqualInt(0, archive_entry_size(ae));
	assert(archive_entry_size_is_set(ae));
	assertEqualIntA(a, 0, archive_read_data(a, filedata, 10));

#ifdef HAVE_ZLIB_H
	/*
	 * Deflate compression option:
	 */

	/* Read and verify first file. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt(1, archive_entry_mtime(ae));
	/* Zip doesn't store high-resolution mtime. */
	assertEqualInt(0, archive_entry_mtime_nsec(ae));
	assertEqualInt(0, archive_entry_atime(ae));
	assertEqualInt(0, archive_entry_ctime(ae));
	assertEqualString("file_deflate", archive_entry_pathname(ae));
	if (seeking || improved_streaming) {
		assertEqualInt(AE_IFREG | 0755, archive_entry_mode(ae));
	}
	if (seeking) {
		assertEqualInt(8, archive_entry_size(ae));
		assert(archive_entry_size_is_set(ae));
	} else {
		assertEqualInt(0, archive_entry_size_is_set(ae));
	}
	assertEqualIntA(a, 8,
	    archive_read_data(a, filedata, sizeof(filedata)));
	assertEqualMem(filedata, "12345678", 8);


	/* Read the second file back. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt(1, archive_entry_mtime(ae));
	assertEqualInt(0, archive_entry_mtime_nsec(ae));
	assertEqualInt(0, archive_entry_atime(ae));
	assertEqualInt(0, archive_entry_ctime(ae));
	assertEqualString("file2_deflate", archive_entry_pathname(ae));
	if (seeking || improved_streaming) {
		assertEqualInt(AE_IFREG | 0755, archive_entry_mode(ae));
	}
	if (seeking) {
		assertEqualInt(4, archive_entry_size(ae));
		assert(archive_entry_size_is_set(ae));
	} else {
		assertEqualInt(0, archive_entry_size_is_set(ae));
	}
	assertEqualIntA(a, 4,
	    archive_read_data(a, filedata, sizeof(filedata)));
	assertEqualMem(filedata, "1234", 4);

	/* Read the third file back. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt(2, archive_entry_mtime(ae));
	assertEqualInt(0, archive_entry_mtime_nsec(ae));
	assertEqualInt(0, archive_entry_atime(ae));
	assertEqualInt(0, archive_entry_ctime(ae));
	assertEqualString("file3_deflate", archive_entry_pathname(ae));
	if (seeking || improved_streaming) {
		assertEqualInt(AE_IFREG | 0621, archive_entry_mode(ae));
	}
	if (seeking) {
		assertEqualInt(5, archive_entry_size(ae));
		assert(archive_entry_size_is_set(ae));
	} else {
		assertEqualInt(0, archive_entry_size_is_set(ae));
	}
	assertEqualIntA(a, 5,
	    archive_read_data(a, filedata, sizeof(filedata)));
	assertEqualMem(filedata, "ghijk", 4);

	/* Read symlink. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt(1, archive_entry_mtime(ae));
	assertEqualInt(0, archive_entry_mtime_nsec(ae));
	assertEqualInt(0, archive_entry_atime(ae));
	assertEqualInt(0, archive_entry_ctime(ae));
	assertEqualString("symlink_deflate", archive_entry_pathname(ae));
	if (seeking || improved_streaming) {
		assertEqualInt(AE_IFLNK | 0755, archive_entry_mode(ae));
		assertEqualInt(0, archive_entry_size(ae));
		assertEqualString("file1", archive_entry_symlink(ae));
	} else {
		assertEqualInt(AE_IFREG | 0664, archive_entry_mode(ae));
		assertEqualInt(5, archive_entry_size(ae));
		assertEqualIntA(a, 5, archive_read_data(a, filedata, 10));
		assertEqualMem(filedata, "file1", 5);
	}

	/* Read the dir entry back. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt(11, archive_entry_mtime(ae));
	assertEqualInt(0, archive_entry_mtime_nsec(ae));
	assertEqualInt(0, archive_entry_atime(ae));
	assertEqualInt(0, archive_entry_ctime(ae));
	assertEqualString("dir_deflate/", archive_entry_pathname(ae));
	if (seeking) {
		assertEqualInt(AE_IFDIR | 0755, archive_entry_mode(ae));
	}
	assertEqualInt(0, archive_entry_size(ae));
	assert(archive_entry_size_is_set(ae));
	assertEqualIntA(a, 0, archive_read_data(a, filedata, 10));
#endif

	/*
	 * Store compression option:
	 */

	/* Read and verify first file. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt(1, archive_entry_mtime(ae));
	/* Zip doesn't store high-resolution mtime. */
	assertEqualInt(0, archive_entry_mtime_nsec(ae));
	assertEqualInt(0, archive_entry_atime(ae));
	assertEqualInt(0, archive_entry_ctime(ae));
	assertEqualString("file_stored", archive_entry_pathname(ae));
	if (seeking || improved_streaming) {
		assertEqualInt(AE_IFREG | 0755, archive_entry_mode(ae));
	}
	if (seeking) {
		assert(archive_entry_size_is_set(ae));
		assertEqualInt(8, archive_entry_size(ae));
	} else {
		assertEqualInt(0, archive_entry_size_is_set(ae));
	}
	assertEqualIntA(a, 8,
	    archive_read_data(a, filedata, sizeof(filedata)));
	assertEqualMem(filedata, "12345678", 8);


	/* Read the second file back. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt(1, archive_entry_mtime(ae));
	assertEqualInt(0, archive_entry_mtime_nsec(ae));
	assertEqualInt(0, archive_entry_atime(ae));
	assertEqualInt(0, archive_entry_ctime(ae));
	assertEqualString("file2_stored", archive_entry_pathname(ae));
	if (seeking || improved_streaming) {
		assertEqualInt(AE_IFREG | 0755, archive_entry_mode(ae));
	}
	if (seeking) {
		assertEqualInt(4, archive_entry_size(ae));
		assert(archive_entry_size_is_set(ae));
	} else {
		assertEqualInt(0, archive_entry_size_is_set(ae));
	}
	assertEqualIntA(a, 4,
	    archive_read_data(a, filedata, sizeof(filedata)));
	assertEqualMem(filedata, "ACEG", 4);

	/* Read the third file back. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt(2, archive_entry_mtime(ae));
	assertEqualInt(0, archive_entry_mtime_nsec(ae));
	assertEqualInt(0, archive_entry_atime(ae));
	assertEqualInt(0, archive_entry_ctime(ae));
	assertEqualString("file3_stored", archive_entry_pathname(ae));
	if (seeking || improved_streaming)
		assertEqualInt(AE_IFREG | 0621, archive_entry_mode(ae));
	if (seeking) {
		assertEqualInt(5, archive_entry_size(ae));
		assert(archive_entry_size_is_set(ae));
	} else {
		assertEqualInt(0, archive_entry_size_is_set(ae));
	}
	assertEqualIntA(a, 5,
	    archive_read_data(a, filedata, sizeof(filedata)));
	assertEqualMem(filedata, "ijklm", 4);

	/* Read symlink. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt(1, archive_entry_mtime(ae));
	assertEqualInt(0, archive_entry_mtime_nsec(ae));
	assertEqualInt(0, archive_entry_atime(ae));
	assertEqualInt(0, archive_entry_ctime(ae));
	assertEqualString("symlink_stored", archive_entry_pathname(ae));
	if (seeking || improved_streaming) {
		assertEqualInt(AE_IFLNK | 0755, archive_entry_mode(ae));
		assertEqualInt(0, archive_entry_size(ae));
		assertEqualString("file1", archive_entry_symlink(ae));
	} else {
		assertEqualInt(AE_IFREG | 0664, archive_entry_mode(ae));
		assertEqualInt(5, archive_entry_size(ae));
		assertEqualIntA(a, 5, archive_read_data(a, filedata, 10));
		assertEqualMem(filedata, "file1", 5);
	}

	/* Read the dir entry back. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt(11, archive_entry_mtime(ae));
	assertEqualInt(0, archive_entry_mtime_nsec(ae));
	assertEqualInt(0, archive_entry_atime(ae));
	assertEqualInt(0, archive_entry_ctime(ae));
	assertEqualString("dir_stored/", archive_entry_pathname(ae));
	if (seeking || improved_streaming)
		assertEqualInt(AE_IFDIR | 0755, archive_entry_mode(ae));
	assertEqualInt(0, archive_entry_size(ae));
	assertEqualIntA(a, 0, archive_read_data(a, filedata, 10));

	/* Verify the end of the archive. */
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));
	assertEqualInt(ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}